

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O1

void idwt_per_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_50;
  
  uVar1 = lpr_len / 2;
  uVar5 = (len_cA + uVar1) - 1;
  if (0 < (int)uVar5) {
    lVar7 = (long)istride;
    lVar12 = (long)len_cA;
    iVar3 = len_cA * istride;
    local_50 = -(lVar7 * lVar12);
    lVar9 = -2;
    lVar13 = -1;
    uVar8 = 0;
    do {
      lVar9 = lVar9 + 2;
      lVar13 = lVar13 + 2;
      lVar10 = lVar9 * ostride;
      lVar14 = lVar13 * ostride;
      X[lVar10] = 0.0;
      X[lVar14] = 0.0;
      if (1 < lpr_len) {
        lVar15 = 8;
        lVar17 = 0;
        lVar4 = 0;
        lVar6 = local_50;
        iVar11 = iVar3;
        do {
          lVar2 = uVar8 + lVar17;
          if (lVar2 < lVar12 && -1 < lVar2) {
            lVar16 = (uVar8 - lVar4) * lVar7;
LAB_001100b5:
            X[lVar10] = *(double *)((long)lpr + lVar15 + -8) * cA[lVar16] +
                        *(double *)((long)hpr + lVar15 + -8) * cD[lVar16] + X[lVar10];
            X[lVar14] = *(double *)((long)lpr + lVar15) * cA[lVar16] +
                        *(double *)((long)hpr + lVar15) * cD[lVar16] + X[lVar14];
          }
          else {
            lVar16 = lVar6;
            if (lVar2 < len_cA + lpr_len + -1 && lVar12 <= lVar2) goto LAB_001100b5;
            if ((lVar2 < 0) && ((int)-uVar1 < lVar2)) {
              lVar16 = (long)iVar11;
              goto LAB_001100b5;
            }
          }
          lVar4 = lVar4 + 1;
          iVar11 = iVar11 - istride;
          lVar17 = lVar17 + -1;
          lVar6 = lVar6 - lVar7;
          lVar15 = lVar15 + 0x10;
        } while (-(ulong)uVar1 != lVar17);
      }
      uVar8 = uVar8 + 1;
      iVar3 = iVar3 + istride;
      local_50 = local_50 + lVar7;
    } while (uVar8 != uVar5);
  }
  return;
}

Assistant:

void idwt_per_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, l2;
	int is, ms, ns;

	len_avg = lpr_len;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				is = (i - l - len_cA) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				is = (len_cA + i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}